

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O3

void cilk_fiber_pool_free_fibers_from_pool
               (cilk_fiber_pool *pool,uint num_to_keep,cilk_fiber *fiber_to_return)

{
  spin_mutex *psVar1;
  cilk_fiber **ppcVar2;
  cilk_fiber_sysdep *this;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  cilk_fiber_sysdep *self;
  ulong uVar8;
  bool bVar9;
  cilk_fiber *fibers_to_free [10];
  undefined8 auStack_88 [11];
  
  psVar1 = pool->lock;
  do {
    if (psVar1 != (spin_mutex *)0x0) {
      spin_mutex_lock(pool->lock);
    }
    uVar4 = pool->size;
    uVar7 = (ulong)uVar4;
    uVar8 = 0;
    if (num_to_keep < uVar4) {
      ppcVar2 = pool->fibers;
      lVar5 = -1;
      uVar6 = 0;
      do {
        uVar8 = uVar6 + 1;
        auStack_88[uVar6] = ppcVar2[uVar7 + lVar5];
        bVar3 = (ulong)num_to_keep < uVar7 + lVar5;
        if (uVar7 + lVar5 <= (ulong)num_to_keep) break;
        lVar5 = lVar5 + -1;
        bVar9 = uVar6 < 9;
        uVar6 = uVar8;
      } while (bVar9);
      uVar4 = uVar4 - (int)uVar8;
      uVar7 = (ulong)uVar4;
      pool->size = uVar4;
    }
    else {
      bVar3 = false;
    }
    pool->total = pool->total - (int)uVar8;
    if (fiber_to_return == (cilk_fiber *)0x0 || bVar3) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if (pool->max_size <= (uint)uVar7) {
        cilk_fiber_pool_free_fibers_from_pool();
      }
      pool->fibers[uVar7] = fiber_to_return;
      pool->size = (uint)uVar7 + 1;
      bVar3 = true;
    }
    if (psVar1 != (spin_mutex *)0x0) {
      spin_mutex_unlock(pool->lock);
    }
    if ((int)uVar8 != 0) {
      uVar7 = 0;
      do {
        this = (cilk_fiber_sysdep *)auStack_88[uVar7];
        cilk_fiber_sysdep::~cilk_fiber_sysdep(this);
        __cilkrts_free(this);
        uVar7 = uVar7 + 1;
      } while ((uVar8 & 0xffffffff) != uVar7);
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

static void cilk_fiber_pool_free_fibers_from_pool(cilk_fiber_pool* pool,
                                                  unsigned num_to_keep,
                                                  cilk_fiber* fiber_to_return)
{
    // Free our own fibers, until we fall below our desired threshold.
    // Each iteration of this loop proceeds in the following stages:
    //   1.  Acquire the pool lock,
    //   2.  Grabs up to B fibers from the pool, stores them into a buffer.
    //   3.  Check if pool is empty enough.  If yes, put the last fiber back,
    //       and remember that we should quit.
    //   4.  Release the pool lock, and actually free any buffered fibers.
    //   5.  Check if we are done and should exit the loop.  Otherwise, try again.
    // 
    const bool need_lock = pool->lock;
    bool last_fiber_returned = false;
    
    do {
        const int B = 10;   // Pull at most this many fibers from the
                            // parent for one lock acquisition.  Make
                            // this value large enough to amortize
                            // against the cost of acquiring and
                            // releasing the lock.
        int num_to_free = 0;
        cilk_fiber* fibers_to_free[B];

        // Stage 1: Grab the lock.
        if (need_lock) {
            spin_mutex_lock(pool->lock);
        }
        
        // Stage 2: Grab up to B fibers to free.
        int fibers_freed = 0;
        while ((pool->size > num_to_keep) && (num_to_free < B)) {
            fibers_to_free[num_to_free++] = pool->fibers[--pool->size];
            fibers_freed++;
        }
        decrement_pool_total(pool, fibers_freed);

        // Stage 3.  Pool is below threshold.  Put extra fiber back.
        if (pool->size <= num_to_keep) {
            // Put the last fiber back into the pool.
            if (fiber_to_return) {
                CILK_ASSERT(pool->size < pool->max_size);
                pool->fibers[pool->size] = fiber_to_return;
                pool->size++;
            }
            last_fiber_returned = true;
        }
        
        // Stage 4: Release the lock, and actually free any fibers
        // buffered.
        if (need_lock) {
            spin_mutex_unlock(pool->lock);
        }

        for (int i = 0; i < num_to_free; ++i) {
            fibers_to_free[i]->deallocate_to_heap();
        }
        
    } while (!last_fiber_returned);
}